

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_frequency_transform.cc
# Opt level: O2

void __thiscall
sptk::SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform
          (SecondOrderAllPassFrequencyTransform *this,int num_input_order,int num_output_order,
          int fft_length,double alpha,double theta)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pvVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  int m2;
  ulong uVar10;
  ulong uVar11;
  int j;
  size_type __n;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<double,_std::allocator<double>_> ww;
  vector<double,_std::allocator<double>_> dw;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  InverseFastFourierTransform inverse_fourier_transform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  _Vector_base<double,_std::allocator<double>_> local_138;
  _Vector_base<double,_std::allocator<double>_> local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_108;
  InverseFastFourierTransform local_f0;
  double local_b8;
  double local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a0;
  double local_88;
  double dStack_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  this->_vptr_SecondOrderAllPassFrequencyTransform =
       (_func_int **)&PTR__SecondOrderAllPassFrequencyTransform_0011a750;
  this->num_input_order_ = num_input_order;
  this->num_output_order_ = num_output_order;
  this->alpha_ = alpha;
  this->theta_ = theta;
  this->is_valid_ = true;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_input_order < fft_length && -1 < (num_output_order | num_input_order)) {
    this_00 = &this->conversion_matrix_;
    local_b8 = alpha;
    bVar7 = IsValidAlpha(alpha);
    if ((bVar7) && (bVar7 = IsInRange(this->theta_,0.0,3.141592653589793), bVar7)) {
      iVar1 = this->num_input_order_;
      iVar2 = this->num_output_order_;
      uVar10 = (ulong)(uint)fft_length;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_f0,uVar10,
                 (allocator_type *)&local_a0);
      __n = (long)iVar2 + 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_108,__n,(value_type *)&local_f0,(allocator_type *)&local_138);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_f0);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_f0,uVar10,
                 (allocator_type *)&local_138);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_a0,__n,(value_type *)&local_f0,(allocator_type *)&local_120);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_f0);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_138,uVar10,
                 (allocator_type *)&local_f0);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_120,uVar10,
                 (allocator_type *)&local_f0);
      local_a8 = 6.283185307179586 / (double)fft_length;
      local_68 = local_b8 * local_b8;
      uVar10 = 0;
      uVar11 = 0;
      if (0 < fft_length) {
        uVar11 = (ulong)(uint)fft_length;
      }
      local_78._8_4_ = SUB84(local_b8,0);
      local_78._0_8_ = local_b8;
      local_78._12_4_ = (int)((ulong)local_b8 >> 0x20);
      local_88 = -local_68;
      dStack_80 = -local_68;
      local_58 = -(local_b8 + local_b8);
      dStack_50 = -(local_b8 + local_b8);
      dStack_60 = local_68;
      for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        dVar13 = (double)(int)uVar10 * local_a8;
        dVar14 = Warp(dVar13,local_b8,theta);
        local_138._M_impl.super__Vector_impl_data._M_start[uVar10] = dVar14;
        local_48 = cos(dVar13 - theta);
        dVar13 = cos(dVar13 + theta);
        auVar15._0_8_ = (double)local_78._0_8_ * local_48 + local_88;
        auVar15._8_8_ = (double)local_78._8_8_ * dVar13 + dStack_80;
        dVar13 = dVar13 * dStack_50 + 1.0 + dStack_60;
        auVar16._8_4_ = SUB84(dVar13,0);
        auVar16._0_8_ = local_48 * local_58 + 1.0 + local_68;
        auVar16._12_4_ = (int)((ulong)dVar13 >> 0x20);
        auVar16 = divpd(auVar15,auVar16);
        local_120._M_impl.super__Vector_impl_data._M_start[uVar10] =
             auVar16._8_8_ + auVar16._0_8_ + 1.0;
      }
      InverseFastFourierTransform::InverseFastFourierTransform(&local_f0,fft_length);
      lVar12 = 0;
      do {
        if (this->num_output_order_ < lVar12) {
          InverseFastFourierTransform::~InverseFastFourierTransform(&local_f0);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(this_00,__n);
          for (lVar12 = 0; uVar3 = this->num_output_order_, lVar12 <= (int)uVar3;
              lVar12 = lVar12 + 1) {
            std::vector<double,_std::allocator<double>_>::resize
                      ((this_00->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar12,(long)iVar1 + 1);
            iVar2 = this->num_input_order_;
            pvVar5 = (this->conversion_matrix_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            for (lVar8 = 0; lVar8 <= iVar2; lVar8 = lVar8 + 1) {
              *(double *)
               (*(long *)&pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + lVar8 * 8) =
                   local_108.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
            }
          }
          pvVar5 = (this->conversion_matrix_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          uVar10 = (ulong)(uint)this->num_input_order_;
          if (this->num_input_order_ < 1) {
            uVar10 = uVar11;
          }
          for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            lVar12 = *(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data;
            *(double *)(lVar12 + 8 + uVar11 * 8) = *(double *)(lVar12 + 8 + uVar11 * 8) * 0.5;
          }
          pvVar5 = (this_00->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          uVar10 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar10 = uVar11;
          }
          for (; uVar10 * 0x18 - uVar11 != 0; uVar11 = uVar11 + 0x18) {
            pdVar6 = *(double **)
                      ((long)&pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + uVar11);
            dVar13 = *pdVar6;
            *pdVar6 = dVar13 + dVar13;
          }
LAB_00109cdc:
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_a0);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_108);
          return;
        }
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          dVar13 = cos(local_138._M_impl.super__Vector_impl_data._M_start[uVar10] *
                       (double)(int)lVar12);
          local_108.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar12].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] = dVar13 * local_120._M_impl.super__Vector_impl_data._M_start[uVar10];
          dVar13 = sin(local_138._M_impl.super__Vector_impl_data._M_start[uVar10] *
                       (double)(int)lVar12);
          local_a0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar12].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] = -dVar13 * local_120._M_impl.super__Vector_impl_data._M_start[uVar10];
        }
        bVar7 = InverseFastFourierTransform::Run
                          (&local_f0,
                           local_108.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar12,
                           local_a0.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar12);
        if (!bVar7) {
          this->is_valid_ = false;
          InverseFastFourierTransform::~InverseFastFourierTransform(&local_f0);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
          goto LAB_00109cdc;
        }
        uVar10 = (ulong)(uint)this->num_input_order_;
        if (this->num_input_order_ < 1) {
          uVar10 = 0;
        }
        lVar8 = (long)fft_length;
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          pdVar4 = local_108.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar9 + 1] = pdVar4[lVar8 + -1] + pdVar4[uVar9 + 1];
          lVar8 = lVar8 + -1;
        }
        lVar12 = lVar12 + 1;
      } while( true );
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform(
    int num_input_order, int num_output_order, int fft_length, double alpha,
    double theta)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      theta_(theta),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || !sptk::IsValidAlpha(alpha_) ||
      !sptk::IsInRange(theta_, 0.0, sptk::kPi)) {
    is_valid_ = false;
    return;
  }

  const int input_length(num_input_order_ + 1);
  const int output_length(num_output_order_ + 1);
  std::vector<std::vector<double> > real(output_length,
                                         std::vector<double>(fft_length));
  std::vector<std::vector<double> > imag(output_length,
                                         std::vector<double>(fft_length));
  {
    std::vector<double> ww(fft_length);
    std::vector<double> dw(fft_length);
    {
      const double delta(sptk::kTwoPi / fft_length);
      for (int j(0); j < fft_length; ++j) {
        const double omega(delta * j);
        ww[j] = sptk::Warp(omega, alpha, theta);
        dw[j] = DiffWarp(omega, alpha, theta);
      }
    }

    sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
    for (int m(0); m <= num_output_order_; ++m) {
      for (int j(0); j < fft_length; ++j) {
        real[m][j] = std::cos(ww[j] * m) * dw[j];
        imag[m][j] = -std::sin(ww[j] * m) * dw[j];
      }

      if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
        is_valid_ = false;
        return;
      }

      for (int j(1); j <= num_input_order_; ++j) {
        real[m][j] += real[m][fft_length - j];
      }
    }
  }

  conversion_matrix_.resize(output_length);
  for (int m2(0); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2].resize(input_length);
    for (int m1(0); m1 <= num_input_order_; ++m1) {
      conversion_matrix_[m2][m1] = real[m2][m1];
    }
  }
  for (int m1(1); m1 <= num_input_order_; ++m1) {
    conversion_matrix_[0][m1] *= 0.5;
  }
  for (int m2(1); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2][0] *= 2.0;
  }
}